

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_error_code_e
ktxTexture2_CreateFromMemory
          (ktx_uint8_t *bytes,ktx_size_t size,ktxTextureCreateFlags createFlags,ktxTexture2 **newTex
          )

{
  ktx_error_code_e kVar1;
  ktxTexture2 *This;
  ktxStream stream;
  KTX_header2 header;
  ktxStream local_e8;
  KTX_header2 local_80;
  
  if (newTex == (ktxTexture2 **)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    This = (ktxTexture2 *)malloc(0xa8);
    if (This == (ktxTexture2 *)0x0) {
      kVar1 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar1 = KTX_INVALID_VALUE;
      if (size != 0 && bytes != (ktx_uint8_t *)0x0) {
        kVar1 = ktxMemStream_construct_ro(&local_e8,bytes,size);
        if (kVar1 == KTX_SUCCESS) {
          kVar1 = (*local_e8.read)(&local_e8,&local_80,0x50);
          if (kVar1 == KTX_SUCCESS) {
            kVar1 = ktxTexture2_constructFromStreamAndHeader(This,&local_e8,&local_80,createFlags);
          }
        }
      }
      if (kVar1 != KTX_SUCCESS) {
        free(This);
        This = (ktxTexture2 *)0x0;
      }
      *newTex = This;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_CreateFromMemory(const ktx_uint8_t* bytes, ktx_size_t size,
                             ktxTextureCreateFlags createFlags,
                             ktxTexture2** newTex)
{
    KTX_error_code result;
    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructFromMemory(tex, bytes, size,
                                             createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture2*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}